

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabInitVtab(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,char **pzErr
                     )

{
  size_t sVar1;
  char *pcVar2;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  bool local_95;
  int local_94;
  int local_90;
  int eType;
  int nTab;
  int nDb;
  char *zType;
  char *zTab;
  char *zDb;
  uint local_68;
  int nByte;
  int bDb;
  int rc;
  Fts5VocabTable *pRet;
  char *azSchema [3];
  char **pzErr_local;
  sqlite3_vtab **ppVTab_local;
  char **argv_local;
  int argc_local;
  void *pAux_local;
  sqlite3 *db_local;
  
  pRet = (Fts5VocabTable *)anon_var_dwarf_1b4ab;
  azSchema[0] = "CREATE TABlE vocab(term, doc, cnt)";
  azSchema[1] = "CREATE TABlE vocab(term, doc, col, offset)";
  _bDb = (sqlite3_vtab *)0x0;
  nByte = 0;
  local_95 = false;
  if (argc == 6) {
    sVar1 = strlen(argv[1]);
    local_95 = false;
    if (sVar1 == 4) {
      local_95 = *(int *)argv[1] == 0x706d6574;
    }
  }
  local_68 = (uint)local_95;
  if ((argc == 5) || (local_68 != 0)) {
    if (local_68 == 0) {
      local_a0 = argv[1];
    }
    else {
      local_a0 = argv[3];
    }
    zTab = local_a0;
    if (local_68 == 0) {
      local_a8 = argv[3];
    }
    else {
      local_a8 = argv[4];
    }
    zType = local_a8;
    if (local_68 == 0) {
      local_b0 = argv[4];
    }
    else {
      local_b0 = argv[5];
    }
    _nTab = local_b0;
    sVar1 = strlen(local_a0);
    eType = (int)sVar1 + 1;
    sVar1 = strlen(zType);
    local_90 = (int)sVar1 + 1;
    local_94 = 0;
    nByte = fts5VocabTableType(_nTab,pzErr,&local_94);
    if (nByte == 0) {
      nByte = sqlite3_declare_vtab(db,azSchema[(long)local_94 + -1]);
    }
    zDb._4_4_ = eType + 0x40 + local_90;
    _bDb = (sqlite3_vtab *)sqlite3Fts5MallocZero(&nByte,(long)zDb._4_4_);
    if (_bDb != (sqlite3_vtab *)0x0) {
      _bDb[2].pModule = (sqlite3_module *)pAux;
      _bDb[2].nRef = local_94;
      _bDb[1].zErrMsg = (char *)db;
      _bDb[1].pModule = (sqlite3_module *)&_bDb[2].zErrMsg;
      *(long *)&_bDb[1].nRef = (long)&(_bDb[1].pModule)->iVersion + (long)local_90;
      memcpy(_bDb[1].pModule,zType,(long)local_90);
      memcpy(*(void **)&_bDb[1].nRef,zTab,(long)eType);
      sqlite3Fts5Dequote((char *)_bDb[1].pModule);
      sqlite3Fts5Dequote(*(char **)&_bDb[1].nRef);
    }
  }
  else {
    pcVar2 = sqlite3_mprintf("wrong number of vtable arguments");
    *pzErr = pcVar2;
    nByte = 1;
  }
  *ppVTab = _bDb;
  return nByte;
}

Assistant:

static int fts5VocabInitVtab(
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Pointer to Fts5Global object */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  const char *azSchema[] = { 
    "CREATE TABlE vocab(" FTS5_VOCAB_COL_SCHEMA  ")", 
    "CREATE TABlE vocab(" FTS5_VOCAB_ROW_SCHEMA  ")",
    "CREATE TABlE vocab(" FTS5_VOCAB_INST_SCHEMA ")"
  };

  Fts5VocabTable *pRet = 0;
  int rc = SQLITE_OK;             /* Return code */
  int bDb;

  bDb = (argc==6 && strlen(argv[1])==4 && memcmp("temp", argv[1], 4)==0);

  if( argc!=5 && bDb==0 ){
    *pzErr = sqlite3_mprintf("wrong number of vtable arguments");
    rc = SQLITE_ERROR;
  }else{
    int nByte;                      /* Bytes of space to allocate */
    const char *zDb = bDb ? argv[3] : argv[1];
    const char *zTab = bDb ? argv[4] : argv[3];
    const char *zType = bDb ? argv[5] : argv[4];
    int nDb = (int)strlen(zDb)+1; 
    int nTab = (int)strlen(zTab)+1;
    int eType = 0;
    
    rc = fts5VocabTableType(zType, pzErr, &eType);
    if( rc==SQLITE_OK ){
      assert( eType>=0 && eType<ArraySize(azSchema) );
      rc = sqlite3_declare_vtab(db, azSchema[eType]);
    }

    nByte = sizeof(Fts5VocabTable) + nDb + nTab;
    pRet = sqlite3Fts5MallocZero(&rc, nByte);
    if( pRet ){
      pRet->pGlobal = (Fts5Global*)pAux;
      pRet->eType = eType;
      pRet->db = db;
      pRet->zFts5Tbl = (char*)&pRet[1];
      pRet->zFts5Db = &pRet->zFts5Tbl[nTab];
      memcpy(pRet->zFts5Tbl, zTab, nTab);
      memcpy(pRet->zFts5Db, zDb, nDb);
      sqlite3Fts5Dequote(pRet->zFts5Tbl);
      sqlite3Fts5Dequote(pRet->zFts5Db);
    }
  }

  *ppVTab = (sqlite3_vtab*)pRet;
  return rc;
}